

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
    *this,int i)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int sz;
  ulong uVar6;
  value_type local_68;
  value_type local_48;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&local_48,&this->left_->fadexpr_,i);
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&local_68,&this->right_->fadexpr_,i);
  uVar1 = local_68.dx_.num_elts;
  if (local_68.dx_.num_elts < local_48.dx_.num_elts) {
    uVar1 = local_48.dx_.num_elts;
  }
  __return_storage_ptr__->val_ = local_48.val_ + local_68.val_;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar1 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar1;
    uVar6 = (ulong)uVar1;
    pdVar2 = (double *)operator_new__(uVar6 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar2;
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < (int)uVar1) {
      pdVar2 = (__return_storage_ptr__->dx_).ptr_to_data;
      lVar3 = 0;
      do {
        pdVar4 = (double *)((long)local_48.dx_.ptr_to_data + lVar3);
        if (local_48.dx_.num_elts == 0) {
          pdVar4 = &local_48.defaultVal;
        }
        pdVar5 = (double *)((long)local_68.dx_.ptr_to_data + lVar3);
        if (local_68.dx_.num_elts == 0) {
          pdVar5 = &local_68.defaultVal;
        }
        *(double *)((long)pdVar2 + lVar3) = *pdVar4 + *pdVar5;
        lVar3 = lVar3 + 8;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  Fad<double>::~Fad(&local_68);
  Fad<double>::~Fad(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}